

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O3

void soplex::
     SPxShellsort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
               (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *keys,int end,IdxCompare *compare,int start)

{
  int iVar1;
  int iVar2;
  int a;
  int iVar3;
  int iVar4;
  int32_t iVar5;
  fpclass_type fVar6;
  int32_t iVar7;
  bool bVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar13;
  uint *puVar14;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar15;
  int iVar16;
  long lVar17;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar18;
  bool bVar19;
  byte bVar20;
  uint local_a0 [28];
  
  bVar20 = 0;
  lVar9 = 2;
  do {
    iVar1 = SPxShellsort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxCompare>
            ::incs[lVar9];
    lVar10 = (long)start + (long)iVar1;
    lVar17 = lVar10;
    iVar16 = start;
    if ((int)lVar10 <= end) {
      do {
        pNVar13 = keys + lVar17;
        puVar14 = local_a0;
        for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
          *puVar14 = (pNVar13->val).m_backend.data._M_elems[0];
          pNVar13 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pNVar13 + (ulong)bVar20 * -8 + 4);
          puVar14 = puVar14 + (ulong)bVar20 * -2 + 1;
        }
        iVar2 = keys[lVar17].val.m_backend.exp;
        bVar19 = keys[lVar17].val.m_backend.neg;
        fVar6 = keys[lVar17].val.m_backend.fpclass;
        iVar7 = keys[lVar17].val.m_backend.prec_elem;
        a = keys[lVar17].idx;
        iVar11 = (int)lVar17;
        iVar4 = iVar16;
        if (lVar10 <= lVar17) {
          do {
            bVar8 = EQ(a,keys[iVar4].idx);
            iVar11 = iVar4;
            if ((bVar8) || (iVar3 = keys[iVar4].idx, iVar3 <= a)) break;
            iVar11 = iVar1 + iVar4;
            pNVar18 = keys + iVar4;
            pNVar13 = pNVar18;
            pNVar15 = keys + iVar11;
            for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pNVar15->val).m_backend.data._M_elems[0] = (pNVar13->val).m_backend.data._M_elems[0];
              pNVar13 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)((long)pNVar13 + (ulong)bVar20 * -8 + 4);
              pNVar15 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)((long)pNVar15 + (ulong)bVar20 * -8 + 4);
            }
            keys[iVar11].val.m_backend.exp = (pNVar18->val).m_backend.exp;
            keys[iVar11].val.m_backend.neg = (pNVar18->val).m_backend.neg;
            iVar5 = (pNVar18->val).m_backend.prec_elem;
            keys[iVar11].val.m_backend.fpclass = (pNVar18->val).m_backend.fpclass;
            keys[iVar11].val.m_backend.prec_elem = iVar5;
            keys[iVar11].idx = iVar3;
            iVar11 = iVar4 - iVar1;
            bVar8 = (int)lVar10 <= iVar4;
            iVar4 = iVar11;
          } while (bVar8);
          iVar11 = iVar11 + iVar1;
        }
        puVar14 = local_a0;
        pNVar13 = keys + iVar11;
        for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
          (pNVar13->val).m_backend.data._M_elems[0] = *puVar14;
          puVar14 = puVar14 + (ulong)bVar20 * -2 + 1;
          pNVar13 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pNVar13 + (ulong)bVar20 * -8 + 4);
        }
        keys[iVar11].val.m_backend.exp = iVar2;
        keys[iVar11].val.m_backend.neg = bVar19;
        keys[iVar11].val.m_backend.fpclass = fVar6;
        keys[iVar11].val.m_backend.prec_elem = iVar7;
        keys[iVar11].idx = a;
        lVar17 = lVar17 + 1;
        iVar16 = iVar16 + 1;
      } while (end + 1 != (int)lVar17);
    }
    bVar19 = lVar9 == 0;
    lVar9 = lVar9 + -1;
    if (bVar19) {
      return;
    }
  } while( true );
}

Assistant:

void SPxShellsort(T* keys, int end, COMPARATOR& compare, int start = 0)
{
   static const int incs[3] = {1, 5, 19}; /* sequence of increments */
   int k;

   assert(start <= end);

   for(k = 2; k >= 0; --k)
   {
      int h = incs[k];
      int first = h + start;
      int i;

      for(i = first; i <= end; ++i)
      {
         int j;
         T tempkey = keys[i];

         j = i;

         while(j >= first && compare(tempkey, keys[j - h]) < 0)
         {
            keys[j] = keys[j - h];
            j -= h;
         }

         keys[j] = tempkey;
      }
   }
}